

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtPubkeyList
              (void *handle,void *psbt_handle,int kind,uint32_t index,uint32_t *list_num,
              void **pubkey_list_handle)

{
  Psbt *this;
  pointer pPVar1;
  pointer pKVar2;
  void *pvVar3;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *this_00;
  CfdException *pCVar4;
  Pubkey *pubkey;
  pointer __args;
  undefined1 local_d4;
  string empty_path;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pk_list;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  int kind_local;
  pointer local_60;
  uint32_t *local_58;
  void **local_50;
  ByteData empty_fingerprint;
  
  kind_local = kind;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&empty_path,"PsbtHandle",(allocator *)&pk_list);
  cfd::capi::CheckBuffer(psbt_handle,&empty_path);
  std::__cxx11::string::~string((string *)&empty_path);
  if (pubkey_list_handle == (void **)0x0) {
    empty_path._M_dataplus._M_p = "cfdcapi_psbt.cpp";
    empty_path._M_string_length = CONCAT44(empty_path._M_string_length._4_4_,0x6d4);
    empty_path.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7cb9d1;
    cfd::core::logger::warn<>((CfdSourceLocation *)&empty_path,"pubkey_list_handle is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&empty_path,"Failed to parameter. pubkey_list_handle is null.",
               (allocator *)&pk_list);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&empty_path);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (list_num == (uint32_t *)0x0) {
    empty_path._M_dataplus._M_p = "cfdcapi_psbt.cpp";
    empty_path._M_string_length = CONCAT44(empty_path._M_string_length._4_4_,0x6da);
    empty_path.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7cb9d1;
    cfd::core::logger::warn<>((CfdSourceLocation *)&empty_path,"list_num is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&empty_path,"Failed to parameter. list_num is null.",(allocator *)&pk_list)
    ;
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&empty_path);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = *(Psbt **)((long)psbt_handle + 0x18);
  if (this == (Psbt *)0x0) {
    empty_path._M_dataplus._M_p = "cfdcapi_psbt.cpp";
    empty_path._M_string_length = CONCAT44(empty_path._M_string_length._4_4_,0x6e0);
    empty_path.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7cb9d1;
    cfd::core::logger::warn<>((CfdSourceLocation *)&empty_path,"psbt is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&empty_path,"Failed to handle statement. psbt is null.",
               (allocator *)&pk_list);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,&empty_path);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pk_list.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pk_list.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pk_list.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = list_num;
  local_50 = pubkey_list_handle;
  switch(kind) {
  case 1:
    cfd::core::Psbt::GetTxInSignaturePubkeyList
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&empty_path,this,
               index);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::_M_move_assign
              (&pk_list,&empty_path);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&empty_path);
    goto LAB_0038adf3;
  case 2:
    cfd::core::Psbt::GetTxInKeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&empty_path,this,
               index);
    break;
  case 3:
    cfd::core::Psbt::GetTxOutKeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&empty_path,this,
               index);
    break;
  case 4:
    cfd::core::Psbt::GetGlobalXpubkeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&empty_path,this);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::_M_move_assign
              (&key_list,&empty_path);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&empty_path);
    local_d4 = 1;
    goto LAB_0038adfb;
  default:
    empty_path._M_dataplus._M_p = "cfdcapi_psbt.cpp";
    empty_path._M_string_length = CONCAT44(empty_path._M_string_length._4_4_,0x6f9);
    empty_path.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7cb9d1;
    cfd::core::logger::warn<int&>
              ((CfdSourceLocation *)&empty_path,"kind is invalid: {}",&kind_local);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&empty_path,"Failed to parameter. kind is invalid.",
               (allocator *)&empty_fingerprint);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&empty_path);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::_M_move_assign
            (&key_list,&empty_path);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)&empty_path);
LAB_0038adf3:
  local_d4 = 0;
LAB_0038adfb:
  pKVar2 = key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_60 = key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_start ==
      key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    cfd::core::ByteData::ByteData(&empty_fingerprint);
    empty_path._M_dataplus._M_p = (pointer)&empty_path.field_2;
    empty_path._M_string_length = 0;
    empty_path.field_2._M_allocated_capacity =
         empty_path.field_2._M_allocated_capacity & 0xffffffffffffff00;
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::reserve
              (&key_list,
               ((long)pk_list.
                      super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)pk_list.
                     super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    pPVar1 = pk_list.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (__args = pk_list.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                  _M_impl.super__Vector_impl_data._M_start; __args != pPVar1; __args = __args + 1) {
      std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
      emplace_back<cfd::core::Pubkey_const&,std::__cxx11::string&,cfd::core::ByteData&>
                ((vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>> *)&key_list,__args,
                 &empty_path,&empty_fingerprint);
    }
    std::__cxx11::string::~string((string *)&empty_path);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_fingerprint);
  }
  std::__cxx11::string::string
            ((string *)&empty_path,"PsbtPubkeyList",(allocator *)&empty_fingerprint);
  pvVar3 = cfd::capi::AllocBuffer(&empty_path,0x20);
  std::__cxx11::string::~string((string *)&empty_path);
  this_00 = (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)operator_new(0x18);
  (this_00->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> **)((long)pvVar3 + 0x18) =
       this_00;
  *(bool *)((long)pvVar3 + 0x10) = local_60 != pKVar2;
  *(undefined1 *)((long)pvVar3 + 0x11) = local_d4;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator=(this_00,&key_list)
  ;
  *local_58 = (uint32_t)
              (((long)key_list.
                      super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)key_list.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x150);
  *local_50 = pvVar3;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pk_list);
  return 0;
}

Assistant:

int CfdGetPsbtPubkeyList(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    uint32_t* list_num, void** pubkey_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtPubkeyListHandle* buffer = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey_list_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey_list_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey_list_handle is null.");
    }
    if (list_num == nullptr) {
      warn(CFD_LOG_SOURCE, "list_num is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. list_num is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::vector<Pubkey> pk_list;
    std::vector<KeyData> key_list;
    bool has_bip32_list = true;
    bool has_xpub_list = false;
    switch (kind) {
      case kCfdPsbtRecordInputSignature:
        pk_list = psbt_obj->psbt->GetTxInSignaturePubkeyList(index);
        break;
      case kCfdPsbtRecordInputBip32:
        key_list = psbt_obj->psbt->GetTxInKeyDataList(index);
        break;
      case kCfdPsbtRecordOutputBip32:
        key_list = psbt_obj->psbt->GetTxOutKeyDataList(index);
        break;
      case kCfdPsbtRecordGloalXpub:
        key_list = psbt_obj->psbt->GetGlobalXpubkeyDataList();
        has_xpub_list = true;
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }
    if (key_list.empty()) {
      has_bip32_list = false;
      ByteData empty_fingerprint;
      std::string empty_path;
      key_list.reserve(pk_list.size());
      for (const auto& pubkey : pk_list) {
        key_list.emplace_back(pubkey, empty_path, empty_fingerprint);
      }
    }

    buffer = static_cast<CfdCapiPsbtPubkeyListHandle*>(AllocBuffer(
        kPrefixPsbtPubkeyList, sizeof(CfdCapiPsbtPubkeyListHandle)));
    buffer->key_list = new std::vector<KeyData>();
    buffer->has_bip32_list = has_bip32_list;
    buffer->has_xpub_list = has_xpub_list;
    *(buffer->key_list) = key_list;
    *list_num = static_cast<uint32_t>(key_list.size());
    *pubkey_list_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreePsbtPubkeyList(handle, buffer);
  return result;
}